

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsBody.h
# Opt level: O3

ChLoadBodyBodyTorque * __thiscall chrono::ChLoadBodyBodyTorque::Clone(ChLoadBodyBodyTorque *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  double dVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ChLoadBodyBodyTorque *this_00;
  
  this_00 = (ChLoadBodyBodyTorque *)::operator_new(0x3d0);
  ChLoadBodyBody::ChLoadBodyBody((ChLoadBodyBody *)this_00,&this->super_ChLoadBodyBody);
  (this_00->super_ChLoadBodyBody).super_ChLoadCustomMultiple.super_ChLoadBase.super_ChObj.
  _vptr_ChObj = (_func_int **)&PTR__ChLoadBodyBodyTorque_00b21280;
  dVar2 = (this->m_torque).m_data[1];
  (this_00->m_torque).m_data[0] = (this->m_torque).m_data[0];
  (this_00->m_torque).m_data[1] = dVar2;
  (this_00->m_torque).m_data[2] = (this->m_torque).m_data[2];
  this_00->m_local_torque = this->m_local_torque;
  p_Var3 = (this->m_modulation).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  p_Var1 = (this->m_modulation).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this_00->m_modulation).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (this->m_modulation).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
  (this_00->m_modulation).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this_00->m_scale = this->m_scale;
  return this_00;
}

Assistant:

virtual ChLoadBodyBodyTorque* Clone() const override { return new ChLoadBodyBodyTorque(*this); }